

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

StringRef __thiscall
mp::internal::TextReader<fmt::Locale>::ReadString(TextReader<fmt::Locale> *this)

{
  char cVar1;
  int iVar2;
  char *loc;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  StringRef SVar6;
  ArgList local_40;
  
  iVar2 = ReadUInt<int>(this);
  pcVar4 = (this->super_ReaderBase).ptr_;
  if (*pcVar4 != ':') {
    local_40.types_ = 0;
    DoReportError(this,pcVar4,(CStringRef)0x20f1bc,&local_40);
    pcVar4 = (this->super_ReaderBase).ptr_;
  }
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  loc = pcVar4 + 1;
  while( true ) {
    (this->super_ReaderBase).ptr_ = loc;
    cVar1 = *loc;
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) break;
    if (cVar1 == '\0') {
      if (loc == (this->super_ReaderBase).end_) {
        local_40.types_ = 0;
        DoReportError(this,loc,(CStringRef)0x21430c,&local_40);
        loc = (this->super_ReaderBase).ptr_;
      }
    }
    else if (cVar1 == '\n') {
      this->line_start_ = loc + 1;
      this->line_ = this->line_ + 1;
    }
    loc = loc + 1;
  }
  if (cVar1 != '\n') {
    local_40.types_ = 0;
    DoReportError(this,loc,(CStringRef)0x2145c1,&local_40);
    loc = (this->super_ReaderBase).ptr_;
  }
  this->line_ = this->line_ + 1;
  pcVar4 = pcVar4 + 1;
  if (iVar2 == 0) {
    pcVar4 = (char *)0x0;
  }
  (this->super_ReaderBase).ptr_ = loc + 1;
  this->line_start_ = loc + 1;
  SVar6.size_ = (size_t)iVar2;
  SVar6.data_ = pcVar4;
  return SVar6;
}

Assistant:

fmt::StringRef mp::internal::TextReader<Locale>::ReadString() {
  int length = ReadUInt();
  if (*ptr_ != ':')
    DoReportError(ptr_, "expected ':'");
  ++ptr_;
  const char *start = ptr_;
  for (int i = 0; i < length; ++i, ++ptr_) {
    char c = *ptr_;
    if (c == '\n') {
      line_start_ = ptr_  + 1;
      ++line_;
    } else if (!c && ptr_ == end_) {
      DoReportError(ptr_, "unexpected end of file in string");
    }
  }
  if (*ptr_ != '\n')
    DoReportError(ptr_, "expected newline");
  ++line_;
  line_start_ = ++ptr_;
  return fmt::StringRef(length != 0 ? start : 0, length);
}